

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol.hpp
# Opt level: O0

void __thiscall
front::symbol::ArraySymbol::ArraySymbol
          (ArraySymbol *this,string *name,SharedSyPtr *item,int layer_num,bool is_const,
          bool is_param)

{
  int iVar1;
  int in_ECX;
  string *in_RDX;
  string *in_RSI;
  Symbol *in_RDI;
  undefined4 in_R8D;
  byte in_R9B;
  shared_ptr<front::symbol::Symbol> *in_stack_ffffffffffffff88;
  string local_40 [34];
  byte local_1e;
  byte local_1d;
  
  local_1d = (byte)in_R8D & 1;
  local_1e = in_R9B & 1;
  std::__cxx11::string::string(local_40,in_RSI);
  Symbol::Symbol(in_RDI,in_RDX,in_ECX);
  std::__cxx11::string::~string(local_40);
  in_RDI->_vptr_Symbol = (_func_int **)&PTR_kind_0036fbb0;
  std::shared_ptr<front::symbol::Symbol>::shared_ptr
            ((shared_ptr<front::symbol::Symbol> *)CONCAT44(in_ECX,in_R8D),in_stack_ffffffffffffff88)
  ;
  *(byte *)&in_RDI[1]._name._M_string_length = local_1d & 1;
  *(byte *)((long)&in_RDI[1]._name._M_string_length + 1) = local_1e & 1;
  std::
  vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
  ::vector((vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
            *)0x2b1333);
  std::
  vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
  ::vector((vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
            *)0x2b1341);
  *(undefined4 *)((long)&in_RDI[1]._name._M_string_length + 4) = 0xffffffff;
  iVar1 = Symbol::symbolId + 1;
  in_RDI->id = Symbol::symbolId;
  Symbol::symbolId = iVar1;
  return;
}

Assistant:

ArraySymbol(string name, SharedSyPtr item, int layer_num, bool is_const,
              bool is_param)
      : _item(item), _is_const(is_const), _is_param(is_param),
        Symbol(name, layer_num) {
    _size = -1;
    id = Symbol::symbolId++;
  }